

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bridge.cpp
# Opt level: O0

void __thiscall ACustomBridge::BeginPlay(ACustomBridge *this)

{
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  ACustomBridge *this_local;
  
  if ((this->super_AActor).args[2] == 0) {
    if ((this->super_AActor).args[0] == 0) {
      local_24 = 0x24;
    }
    else {
      local_24 = (this->super_AActor).args[0];
    }
    (this->super_AActor).radius = (double)local_24;
    if ((this->super_AActor).args[1] == 0) {
      local_28 = 4;
    }
    else {
      local_28 = (this->super_AActor).args[1];
    }
    (this->super_AActor).Height = (double)local_28;
    FRenderStyle::operator=((FRenderStyle *)&(this->super_AActor).RenderStyle.field_0,STYLE_Normal);
  }
  else {
    AActor::SetState(&this->super_AActor,(this->super_AActor).SeeState,false);
    if ((this->super_AActor).args[0] == 0) {
      local_1c = 0x20;
    }
    else {
      local_1c = (this->super_AActor).args[0];
    }
    (this->super_AActor).radius = (double)local_1c;
    if ((this->super_AActor).args[1] == 0) {
      local_20 = 2;
    }
    else {
      local_20 = (this->super_AActor).args[1];
    }
    (this->super_AActor).Height = (double)local_20;
  }
  return;
}

Assistant:

void ACustomBridge::BeginPlay ()
{
	if (args[2]) // Hexen bridge if there are balls
	{
		SetState(SeeState);
		radius = args[0] ? args[0] : 32;
		Height = args[1] ? args[1] : 2;
	}
	else // No balls? Then a Doom bridge.
	{
		radius = args[0] ? args[0] : 36;
		Height = args[1] ? args[1] : 4;
		RenderStyle = STYLE_Normal;
	}
}